

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O3

void Llb_CoreStop(Llb_Img_t *p)

{
  DdManager *table;
  DdNode *n;
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  
  pVVar1 = p->vDdMans;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar1->nSize) {
      lVar3 = 0;
      do {
        table = (DdManager *)pVVar1->pArray[lVar3];
        if (table->bFunc != (DdNode *)0x0) {
          Cudd_RecursiveDeref(table,table->bFunc);
        }
        if (table->bFunc2 != (DdNode *)0x0) {
          Cudd_RecursiveDeref(table,table->bFunc2);
        }
        Extra_StopManager(table);
        lVar3 = lVar3 + 1;
        pVVar1 = p->vDdMans;
      } while (lVar3 < pVVar1->nSize);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      p->vDdMans->pArray = (void **)0x0;
      pVVar1 = p->vDdMans;
      if (pVVar1 == (Vec_Ptr_t *)0x0) goto LAB_0083c3b6;
    }
    free(pVVar1);
    p->vDdMans = (Vec_Ptr_t *)0x0;
  }
LAB_0083c3b6:
  n = p->ddR->bFunc;
  if (n != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,n);
  }
  pVVar1 = p->vRings;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      Cudd_RecursiveDeref(p->ddR,(DdNode *)pVVar1->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar1 = p->vRings;
    } while (lVar3 < pVVar1->nSize);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  Extra_StopManager(p->dd);
  Extra_StopManager(p->ddG);
  Extra_StopManager(p->ddR);
  pVVar2 = p->vDriRefs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vDriRefs->pArray = (int *)0x0;
      pVVar2 = p->vDriRefs;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0083c467;
    }
    free(pVVar2);
    p->vDriRefs = (Vec_Int_t *)0x0;
  }
LAB_0083c467:
  pVVar2 = p->vVarsCs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vVarsCs->pArray = (int *)0x0;
      pVVar2 = p->vVarsCs;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0083c4a3;
    }
    free(pVVar2);
    p->vVarsCs = (Vec_Int_t *)0x0;
  }
LAB_0083c4a3:
  pVVar2 = p->vVarsNs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vVarsNs->pArray = (int *)0x0;
      pVVar2 = p->vVarsNs;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0083c4df;
    }
    free(pVVar2);
    p->vVarsNs = (Vec_Int_t *)0x0;
  }
LAB_0083c4df:
  pVVar2 = p->vCs2Glo;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vCs2Glo->pArray = (int *)0x0;
      pVVar2 = p->vCs2Glo;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0083c51b;
    }
    free(pVVar2);
    p->vCs2Glo = (Vec_Int_t *)0x0;
  }
LAB_0083c51b:
  pVVar2 = p->vNs2Glo;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vNs2Glo->pArray = (int *)0x0;
      pVVar2 = p->vNs2Glo;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0083c557;
    }
    free(pVVar2);
    p->vNs2Glo = (Vec_Int_t *)0x0;
  }
LAB_0083c557:
  pVVar2 = p->vGlo2Cs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vGlo2Cs->pArray = (int *)0x0;
      pVVar2 = p->vGlo2Cs;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0083c593;
    }
    free(pVVar2);
    p->vGlo2Cs = (Vec_Int_t *)0x0;
  }
LAB_0083c593:
  pVVar2 = p->vGlo2Ns;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vGlo2Ns->pArray = (int *)0x0;
      pVVar2 = p->vGlo2Ns;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0083c5c7;
    }
    free(pVVar2);
  }
LAB_0083c5c7:
  free(p);
  return;
}

Assistant:

void Llb_CoreStop( Llb_Img_t * p )
{
    DdManager * dd;
    DdNode * bTemp;
    int i;
    if ( p->vDdMans )
    Vec_PtrForEachEntry( DdManager *, p->vDdMans, dd, i )
    {
        if ( dd->bFunc )
            Cudd_RecursiveDeref( dd, dd->bFunc );
        if ( dd->bFunc2 )
            Cudd_RecursiveDeref( dd, dd->bFunc2 );
        Extra_StopManager( dd );
    }
    Vec_PtrFreeP( &p->vDdMans );
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    Extra_StopManager( p->dd );
    Extra_StopManager( p->ddG );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vDriRefs );
    Vec_IntFreeP( &p->vVarsCs );
    Vec_IntFreeP( &p->vVarsNs );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    ABC_FREE( p );
}